

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vRoots)

{
  void **ppvVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x170,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    __assert_fail("Abc_NodeIsTravIdCurrent(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x171,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  lVar5 = 0;
  do {
    uVar3 = (ulong)(pObj->vFanouts).nSize;
    if ((long)uVar3 <= lVar5) {
LAB_006c6e22:
      if ((int)lVar5 < (int)uVar3) {
        uVar4 = 0;
        uVar3 = (ulong)(uint)vRoots->nSize;
        if (vRoots->nSize < 1) {
          uVar3 = uVar4;
        }
        do {
          if (uVar3 == uVar4) {
            Vec_PtrPush(vRoots,pObj);
            return;
          }
          ppvVar1 = vRoots->pArray + uVar4;
          uVar4 = uVar4 + 1;
        } while ((Abc_Obj_t *)*ppvVar1 != pObj);
      }
      else {
        for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
          Abc_NtkDontCareWinCollectRoots_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]],vRoots);
          uVar3 = (ulong)(uint)(pObj->vFanouts).nSize;
        }
      }
      return;
    }
    iVar2 = Abc_NodeIsTravIdCurrent
                      ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]]);
    if (iVar2 == 0) {
      uVar3 = (ulong)(uint)(pObj->vFanouts).nSize;
      goto LAB_006c6e22;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkDontCareWinCollectRoots_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pObj) );
    assert( Abc_NodeIsTravIdCurrent(pObj) );
    // check if the node has all fanouts marked
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            break;
    // if some of the fanouts are unmarked, add the node to the root
    if ( i < Abc_ObjFanoutNum(pObj) ) 
    {
        Vec_PtrPushUnique( vRoots, pObj );
        return;
    }
    // otherwise, call recursively
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinCollectRoots_rec( pFanout, vRoots );
}